

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O3

void pac_decay_to_limit(tsdn_t *tsdn,pac_t *pac,decay_t *decay,pac_decay_stats_t *decay_stats,
                       ecache_t *ecache,_Bool fully_decay,size_t npages_limit,
                       size_t npages_decay_max)

{
  pthread_mutex_t *__mutex;
  atomic_zu_t *paVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  _Bool _Var4;
  int iVar5;
  ehooks_t *peVar6;
  edata_t *peVar7;
  mutex_prof_data_t *data;
  long lVar8;
  ulong uVar9;
  edata_t *peVar10;
  edata_t *edata;
  long lVar11;
  bool bVar12;
  long local_68;
  
  if ((npages_decay_max != 0) && (decay->purging == false)) {
    decay->purging = true;
    (decay->mtx).field_0.field_0.locked.repr = false;
    __mutex = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48);
    pthread_mutex_unlock(__mutex);
    peVar6 = duckdb_je_base_ehooks_get(pac->base);
    uVar9 = 0;
    peVar10 = (edata_t *)0x0;
    do {
      peVar7 = duckdb_je_ecache_evict(tsdn,pac,peVar6,ecache,npages_limit);
      if (peVar7 == (edata_t *)0x0) {
        edata = peVar10;
        if (uVar9 == 0) goto LAB_01c566d0;
        break;
      }
      (peVar7->field_6).ql_link_inactive.qre_next = peVar7;
      (peVar7->field_6).ql_link_inactive.qre_prev = peVar7;
      edata = peVar7;
      if (peVar10 != (edata_t *)0x0) {
        (peVar7->field_6).ql_link_inactive.qre_next = (peVar10->field_6).ql_link_inactive.qre_prev;
        (peVar10->field_6).ql_link_inactive.qre_prev = peVar7;
        (peVar7->field_6).ql_link_inactive.qre_prev =
             (((peVar7->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
        (((peVar10->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
             peVar10;
        (((peVar7->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar7;
        edata = (peVar7->field_6).ql_link_inactive.qre_next;
      }
      uVar9 = uVar9 + ((peVar7->field_2).e_size_esn >> 0xc);
      peVar10 = edata;
    } while (uVar9 < npages_decay_max);
    peVar6 = duckdb_je_base_ehooks_get(pac->base);
    bVar12 = true;
    if (!fully_decay) {
      bVar12 = (pac->decay_muzzy).time_ms.repr == 0;
    }
    if (edata == (edata_t *)0x0) {
      lVar8 = 0;
      local_68 = 0;
      lVar11 = 0;
    }
    else {
      lVar11 = 0;
      local_68 = 0;
      lVar8 = 0;
      do {
        peVar10 = (edata->field_6).ql_link_inactive.qre_next;
        if (peVar10 == edata) {
          peVar10 = (edata_t *)0x0;
        }
        else {
          (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
               (peVar10->field_6).ql_link_inactive.qre_prev;
          peVar7 = (edata->field_6).ql_link_inactive.qre_prev;
          (((edata->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev = peVar7
          ;
          (edata->field_6).ql_link_inactive.qre_prev = (peVar7->field_6).ql_link_inactive.qre_next;
          peVar7 = (edata->field_6).ql_link_inactive.qre_next;
          (((peVar7->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
               peVar7;
          (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = edata;
        }
        uVar9 = (edata->field_2).e_size_esn >> 0xc;
        if ((ecache->state != extent_state_dirty || bVar12) ||
           (_Var4 = duckdb_je_extent_purge_lazy_wrapper
                              (tsdn,peVar6,edata,0,(edata->field_2).e_size_esn & 0xfffffffffffff000)
           , _Var4)) {
          duckdb_je_extent_dalloc_wrapper(tsdn,pac,peVar6,edata);
          local_68 = local_68 + uVar9;
        }
        else {
          duckdb_je_ecache_dalloc(tsdn,pac,peVar6,&pac->ecache_muzzy,edata);
        }
        lVar8 = lVar8 + uVar9;
        lVar11 = lVar11 + 1;
        edata = peVar10;
      } while (peVar10 != (edata_t *)0x0);
      local_68 = local_68 << 0xc;
    }
    LOCK();
    (decay_stats->npurge).val.repr = (decay_stats->npurge).val.repr + 1;
    UNLOCK();
    LOCK();
    (decay_stats->nmadvise).val.repr = (decay_stats->nmadvise).val.repr + lVar11;
    UNLOCK();
    LOCK();
    (decay_stats->purged).val.repr = (decay_stats->purged).val.repr + lVar8;
    UNLOCK();
    LOCK();
    paVar1 = &pac->stats->pac_mapped;
    paVar1->repr = paVar1->repr - local_68;
    UNLOCK();
LAB_01c566d0:
    iVar5 = pthread_mutex_trylock(__mutex);
    if (iVar5 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&decay->mtx);
      (decay->mtx).field_0.field_0.locked.repr = true;
    }
    puVar2 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar2 = *puVar2 + 1;
    if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar3 = &(decay->mtx).field_0.witness.link.qre_prev;
      *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
    }
    decay->purging = false;
  }
  return;
}

Assistant:

static void
pac_decay_to_limit(tsdn_t *tsdn, pac_t *pac, decay_t *decay,
    pac_decay_stats_t *decay_stats, ecache_t *ecache, bool fully_decay,
    size_t npages_limit, size_t npages_decay_max) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 1);

	if (decay->purging || npages_decay_max == 0) {
		return;
	}
	decay->purging = true;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	edata_list_inactive_t decay_extents;
	edata_list_inactive_init(&decay_extents);
	size_t npurge = pac_stash_decayed(tsdn, pac, ecache, npages_limit,
	    npages_decay_max, &decay_extents);
	if (npurge != 0) {
		size_t npurged = pac_decay_stashed(tsdn, pac, decay,
		    decay_stats, ecache, fully_decay, &decay_extents);
		assert(npurged == npurge);
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	decay->purging = false;
}